

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_delete.hpp
# Opt level: O3

void boost::checked_delete<boost::basic_wrap_stringstream<char>>(basic_wrap_stringstream<char> *x)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  if (x != (basic_wrap_stringstream<char> *)0x0) {
    pcVar2 = (x->m_str)._M_dataplus._M_p;
    paVar1 = &(x->m_str).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)x);
    std::ios_base::~ios_base
              ((ios_base *)
               &(x->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  }
  operator_delete(x,0x198);
  return;
}

Assistant:

inline void checked_delete(T * x)
{
    // intentionally complex - simplification causes regressions
    typedef char type_must_be_complete[ sizeof(T)? 1: -1 ];
    (void) sizeof(type_must_be_complete);
    delete x;
}